

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O3

size_t __thiscall CoreML::Specification::MILSpec::ListValue::ByteSizeLong(ListValue *this)

{
  long lVar1;
  Rep *pRVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  size_t sVar6;
  long lVar7;
  size_t sVar8;
  void **ppvVar9;
  
  sVar8 = (size_t)(this->values_).super_RepeatedPtrFieldBase.current_size_;
  pRVar2 = (this->values_).super_RepeatedPtrFieldBase.rep_;
  ppvVar9 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar9 = (void **)0x0;
  }
  if (sVar8 == 0) {
    sVar8 = 0;
  }
  else {
    lVar1 = sVar8 * 8;
    lVar7 = 0;
    do {
      sVar6 = Value::ByteSizeLong(*(Value **)((long)ppvVar9 + lVar7));
      uVar5 = (uint)sVar6 | 1;
      iVar4 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      sVar8 = sVar8 + sVar6 + (ulong)(iVar4 * 9 + 0x49U >> 6);
      lVar7 = lVar7 + 8;
    } while (lVar1 - lVar7 != 0);
  }
  uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar3 & 1) != 0) {
    sVar8 = sVar8 + *(long *)((uVar3 & 0xfffffffffffffffc) + 0x10);
  }
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type)sVar8;
  return sVar8;
}

Assistant:

size_t ListValue::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.MILSpec.ListValue)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated .CoreML.Specification.MILSpec.Value values = 1;
  total_size += 1UL * this->_internal_values_size();
  for (const auto& msg : this->values_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}